

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateArenaDestructorCode
          (MapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_58,printer,&(this->super_FieldGenerator).variables_);
  file = FieldDescriptor::file((this->super_FieldGenerator).descriptor_);
  bVar1 = HasDescriptorMethods(file,(this->super_FieldGenerator).options_);
  if (bVar1) {
    Formatter::operator()<>((Formatter *)local_58,"_this->$name$_. ~MapField();\n");
  }
  Formatter::~Formatter((Formatter *)local_58);
  return bVar1;
}

Assistant:

bool MapFieldGenerator::GenerateArenaDestructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // _this is the object being destructed (we are inside a static method
    // here).
    format("_this->$name$_. ~MapField();\n");
    return true;
  } else {
    return false;
  }
}